

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufchain.c
# Opt level: O0

void bufchain_fetch(bufchain *ch,void *data,size_t len)

{
  int local_34;
  void *pvStack_30;
  int remlen;
  char *data_c;
  bufchain_granule *tmp;
  size_t len_local;
  void *data_local;
  bufchain *ch_local;
  
  data_c = (char *)ch->head;
  pvStack_30 = data;
  tmp = (bufchain_granule *)len;
  if (ch->buffersize < len) {
    __assert_fail("ch->buffersize >= len",
                  "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/bufchain.c"
                  ,0x87,"void bufchain_fetch(bufchain *, void *, size_t)");
  }
  while( true ) {
    if (tmp == (bufchain_granule *)0x0) {
      return;
    }
    local_34 = (int)tmp;
    if (data_c == (char *)0x0) break;
    if (*(long *)(data_c + 0x10) - *(long *)(data_c + 8) <= (long)local_34) {
      local_34 = (int)*(undefined8 *)(data_c + 0x10) - (int)*(undefined8 *)(data_c + 8);
    }
    memcpy(pvStack_30,*(void **)(data_c + 8),(long)local_34);
    data_c = *(char **)data_c;
    tmp = (bufchain_granule *)((long)tmp - (long)local_34);
    pvStack_30 = (void *)((long)pvStack_30 + (long)local_34);
  }
  __assert_fail("tmp != NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/utils/bufchain.c"
                ,0x8b,"void bufchain_fetch(bufchain *, void *, size_t)");
}

Assistant:

void bufchain_fetch(bufchain *ch, void *data, size_t len)
{
    struct bufchain_granule *tmp;
    char *data_c = (char *)data;

    tmp = ch->head;

    assert(ch->buffersize >= len);
    while (len > 0) {
        int remlen = len;

        assert(tmp != NULL);
        if (remlen >= tmp->bufend - tmp->bufpos)
            remlen = tmp->bufend - tmp->bufpos;
        memcpy(data_c, tmp->bufpos, remlen);

        tmp = tmp->next;
        len -= remlen;
        data_c += remlen;
    }
}